

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,
          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
          e)

{
  BasicStringRef<char> value;
  int iVar1;
  Kind kind;
  ExprBase EVar2;
  BasicWriter<char> *this_00;
  ExprBase in_RDI;
  undefined1 uVar3;
  bool right_associative;
  int prec;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  BasicWriter<char> *in_stack_ffffffffffffffa0;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  in_stack_ffffffffffffffb0;
  BasicWriter<char> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_RDI.impl_,
             in_stack_ffffffffffffffb0,(type_conflict)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  iVar1 = ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::precedence((Expr)0x1c971d);
  uVar3 = iVar1 == 0xb;
  EVar2.impl_ = (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                        ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)
             CONCAT44(iVar1,in_stack_ffffffffffffffe8),(NumericExpr)in_RDI.impl_,
             in_stack_ffffffffffffffe4);
  this_00 = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  kind = internal::ExprBase::kind((ExprBase *)0x1c9788);
  mp::expr::str(kind);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this_00,
             (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  value.size_._0_7_ = in_stack_ffffffffffffffd0;
  value.data_ = (char *)EVar2.impl_;
  value.size_._7_1_ = uVar3;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffc0,value);
  fmt::BasicWriter<char>::operator<<(this_00,in_stack_ffffffffffffff9f);
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
         *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)
             CONCAT44(iVar1,in_stack_ffffffffffffffe8),(NumericExpr)in_RDI.impl_,
             in_stack_ffffffffffffffe4);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteBinary(ExprType e) {
  int prec = precedence(e);
  bool right_associative = prec == prec::EXPONENTIATION;
  Visit(e.lhs(), prec + (right_associative ? 1 : 0));
  writer_ << ' ' << str(e.kind()) << ' ';
  Visit(e.rhs(), prec + (right_associative ? 0 : 1));
}